

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.h
# Opt level: O3

shared_ptr<MovementSystem> __thiscall
entityx::SystemManager::system<MovementSystem>(SystemManager *this)

{
  EntityManager *pEVar1;
  iterator iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<MovementSystem> sVar3;
  Family local_18;
  
  local_18 = System<MovementSystem>::family();
  iVar2 = Catch::clara::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(in_RSI + 0x18),&local_18);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    *(undefined8 *)this = 0;
    this->entity_manager_ = (EntityManager *)0x0;
  }
  else {
    *(undefined8 *)this =
         *(undefined8 *)
          ((long)iVar2.
                 super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>,_false>
                 ._M_cur + 0x10);
    pEVar1 = *(EntityManager **)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>,_false>
                     ._M_cur + 0x18);
    this->entity_manager_ = pEVar1;
    if (pEVar1 != (EntityManager *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(pEVar1 + 8) = *(int *)(pEVar1 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(pEVar1 + 8) = *(int *)(pEVar1 + 8) + 1;
      }
    }
  }
  sVar3.super___shared_ptr<MovementSystem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<MovementSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<MovementSystem>)
         sVar3.super___shared_ptr<MovementSystem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<S> system() {
    auto it = systems_.find(S::family());
    assert(it != systems_.end());
    return it == systems_.end()
        ? std::shared_ptr<S>()
        : std::shared_ptr<S>(std::static_pointer_cast<S>(it->second));
  }